

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QRect>::copyAppend(QGenericArrayOps<QRect> *this,QRect *b,QRect *e)

{
  undefined8 uVar1;
  QRect *pQVar2;
  QRect *pQVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  QRect *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar2 = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x65d067);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pQVar3 = pQVar2 + *(long *)(in_RDI + 0x10);
      uVar1 = *local_10;
      pQVar3->x1 = (Representation)(int)uVar1;
      pQVar3->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      uVar1 = local_10[1];
      pQVar3->x2 = (Representation)(int)uVar1;
      pQVar3->y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
      local_10 = local_10 + 2;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }